

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

int vischar_visible(tgestate_t *state,vischar_t *vischar,uint8_t *left_skip,uint8_t *clipped_width,
                   uint8_t *top_skip,uint8_t *clipped_height)

{
  byte bVar1;
  uint16_t uVar2;
  ushort uVar3;
  uint8_t uVar4;
  ushort uVar5;
  byte bVar6;
  byte bVar7;
  uint8_t uVar8;
  
  *left_skip = 0xff;
  *clipped_width = 0xff;
  *top_skip = 0xff;
  *clipped_height = 0xff;
  uVar8 = (state->isopos).x;
  uVar4 = (state->map_position).x;
  bVar6 = ((char)state->columns + uVar4) - uVar8;
  if ((char)bVar6 < '\x01') {
    return 0xff;
  }
  bVar1 = vischar->width_bytes;
  if (bVar6 < bVar1) {
    uVar8 = '\0';
  }
  else {
    bVar7 = (uVar8 - uVar4) + bVar1;
    if ((char)bVar7 < '\x01') {
      return 0xff;
    }
    bVar6 = bVar1;
    if (bVar7 < bVar1) {
      bVar6 = bVar7;
    }
    uVar8 = bVar1 - bVar7;
    if (bVar1 < bVar7) {
      uVar8 = '\0';
    }
  }
  bVar1 = (state->map_position).y;
  uVar2 = (vischar->isopos).y;
  uVar5 = ((short)state->rows + (ushort)bVar1) * 8 - uVar2;
  if (0xff < uVar5 || uVar5 == 0) {
    return 0xff;
  }
  bVar7 = vischar->height;
  uVar3 = (ushort)bVar7;
  if (uVar5 < uVar3) {
    uVar4 = '\0';
  }
  else {
    uVar5 = uVar3 + uVar2 + (ushort)bVar1 * -8;
    if (0xff < uVar5 || uVar5 == 0) {
      return 0xff;
    }
    if (uVar3 <= uVar5) {
      uVar4 = '\0';
      goto LAB_0010a8a9;
    }
    uVar4 = bVar7 - (char)uVar5;
  }
  bVar7 = (byte)uVar5;
LAB_0010a8a9:
  *left_skip = uVar8;
  *clipped_width = bVar6;
  *top_skip = uVar4;
  *clipped_height = bVar7;
  return 0;
}

Assistant:

int vischar_visible(tgestate_t      *state,
                    const vischar_t *vischar,
                    uint8_t         *left_skip,
                    uint8_t         *clipped_width,
                    uint8_t         *top_skip,
                    uint8_t         *clipped_height)
{
  uint8_t  window_right_edge;   /* was A  */
  int8_t   available_right;     /* was A  */
  uint8_t  new_left;            /* was B  */
  uint8_t  new_width;           /* was C  */
  int8_t   vischar_right_edge;  /* was A  */
  int8_t   available_left;      /* was A  */
  uint16_t window_bottom_edge;  /* was HL */
  uint16_t available_bottom;    /* was HL */
  uint8_t  new_top;             /* was D  */
  uint8_t  new_height;          /* was E  */
  uint16_t vischar_bottom_edge; /* was HL */
  uint16_t available_top;       /* was HL */

  assert(state          != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert(left_skip      != NULL);
  assert(clipped_width  != NULL);
  assert(top_skip       != NULL);
  assert(clipped_height != NULL);

  /* Conv: Added to guarantee initialisation of return values. */
  *left_skip      = 255;
  *clipped_width  = 255;
  *top_skip       = 255;
  *clipped_height = 255;

  /* To determine visibility and sort out clipping there are five cases to
   * consider per axis:
   * (A) vischar is completely off the left/top of screen
   * (B) vischar is clipped on its left/top
   * (C) vischar is entirely visible
   * (D) vischar is clipped on its right/bottom
   * (E) vischar is completely off the right/bottom of screen
   */

  /*
   * Handle horizontal cases.
   */

  /* Calculate the right edge of the window in map space. */
  /* Conv: Columns was constant 24; replaced with state var. */
  window_right_edge = state->map_position.x + state->columns;

  /* Subtracting vischar's x gives the space available between vischar's
   * left edge and the right edge of the window (in bytes).
   * Note that available_right is signed to enable the subsequent test. */
  // state->isopos is isopos / 8.
  available_right = window_right_edge - state->isopos.x;
  if (available_right <= 0)
    /* Case (E): Vischar is beyond the window's right edge. */
    goto not_visible;

  /* Check for vischar partway off-screen. */
  if (available_right < vischar->width_bytes)
  {
    /* Case (D): Vischar's right edge is off-screen so truncate its width. */
    new_left  = 0;
    new_width = available_right;
  }
  else
  {
    /* Calculate the right edge of the vischar. */
    vischar_right_edge = state->isopos.x + vischar->width_bytes;

    /* Subtracting the map position's x gives the space available between
     * vischar's right edge and the left edge of the window (in bytes).
     * Note that available_left is signed to allow the subsequent test. */
    available_left = vischar_right_edge - state->map_position.x;
    if (available_left <= 0)
      /* Case (A): Vischar's right edge is beyond the window's left edge. */
      goto not_visible;

    /* Check for vischar partway off-screen. */
    if (available_left < vischar->width_bytes)
    {
      /* Case (B): Left edge is off-screen and right edge is on-screen. */
      new_left  = vischar->width_bytes - available_left;
      new_width = available_left;
    }
    else
    {
      /* Case (C): No clipping. */
      new_left  = 0;
      new_width = vischar->width_bytes;
    }
  }

  /*
   * Handle vertical cases.
   */

  /* Note: this uses vischar->isopos not state->isopos as above.
   * state->isopos.x/y is vischar->isopos.x/y >> 3. */

  /* Calculate the bottom edge of the window in map space. */
  /* Conv: Rows was constant 17; replaced with state var. */
  window_bottom_edge = state->map_position.y + state->rows;

  /* Subtracting the vischar's y gives the space available between window's
   * bottom edge and the vischar's top. */
  available_bottom = window_bottom_edge * 8 - vischar->isopos.y;
  // FUTURE: The second test here can be gotten rid of if available_bottom is
  //         made signed.
  if (available_bottom <= 0 || available_bottom >= 256)
    /* Case (E): Vischar is beyond the window's bottom edge. */
    goto not_visible;

  /* Check for vischar partway off-screen. */
  if (available_bottom < vischar->height)
  {
    /* Case (D): Vischar's bottom edge is off-screen, so truncate height. */
    new_top    = 0;
    new_height = available_bottom;
  }
  else
  {
    /* Calculate the bottom edge of the vischar. */
    vischar_bottom_edge = vischar->isopos.y + vischar->height;

    /* Subtracting the map position's y (scaled) gives the space available
     * between vischar's bottom edge and the top edge of the window (in
     * rows). */
    available_top = vischar_bottom_edge - state->map_position.y * 8;
    if (available_top <= 0 || available_top >= 256)
      /* Case (A): Vischar's bottom edge is beyond the window's top edge. */
      goto not_visible;

    /* Check for vischar partway off-screen. */
    if (available_top < vischar->height)
    {
      /* Case (B): Top edge is off-screen and bottom edge is on-screen. */
      new_top    = vischar->height - available_top;
      new_height = available_top;
    }
    else
    {
      /* Case (C): No clipping. */
      new_top    = 0;
      new_height = vischar->height;
    }
  }

  *left_skip      = new_left;
  *clipped_width  = new_width;
  *top_skip       = new_top;
  *clipped_height = new_height;

  return 0; /* Visible */


not_visible:
  return 255;
}